

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

float stbir__filter_triangle(float x,float s,void *user_data)

{
  float fVar1;
  
  fVar1 = -x;
  if (-x <= x) {
    fVar1 = x;
  }
  return (float)(~-(uint)(1.0 < fVar1) & (uint)(1.0 - fVar1));
}

Assistant:

static float stbir__filter_triangle(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x <= 1.0f)
    return 1.0f - x;
  else
    return 0.0f;
}